

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real.c
# Opt level: O2

void fft_r2c_exec(fft_real_object obj,double *inp,fft_data *oup)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  uint uVar8;
  fft_object obj_00;
  fft_data *inp_00;
  fft_data *oup_00;
  long lVar9;
  double *pdVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  double *pdVar14;
  long lVar15;
  size_t __size;
  double dVar16;
  double dVar17;
  
  obj_00 = obj->cobj;
  uVar8 = obj_00->N;
  lVar15 = (long)(int)uVar8;
  __size = lVar15 * 0x10;
  inp_00 = (fft_data *)malloc(__size);
  oup_00 = (fft_data *)malloc(__size);
  lVar9 = 0;
  uVar11 = 0;
  if (0 < (int)uVar8) {
    uVar11 = (ulong)uVar8;
  }
  for (; uVar11 * 0x10 != lVar9; lVar9 = lVar9 + 0x10) {
    *(undefined8 *)((long)&inp_00->re + lVar9) = *(undefined8 *)((long)inp + lVar9);
    *(undefined8 *)((long)&inp_00->im + lVar9) = *(undefined8 *)((long)inp + lVar9 + 8);
  }
  fft_exec(obj_00,inp_00,oup_00);
  dVar1 = oup_00->re;
  dVar2 = oup_00->im;
  oup->re = dVar1 + dVar2;
  oup->im = 0.0;
  lVar9 = __size - 8;
  lVar13 = 0x18;
  for (lVar12 = 1; lVar12 < lVar15; lVar12 = lVar12 + 1) {
    dVar3 = *(double *)((long)oup_00 + lVar13 + -8);
    dVar4 = *(double *)((long)&oup_00->re + lVar13);
    dVar5 = *(double *)((long)oup_00 + lVar9 + -8);
    dVar6 = *(double *)((long)&oup_00->re + lVar9);
    dVar16 = dVar4 + dVar6;
    dVar17 = dVar5 - dVar3;
    dVar7 = *(double *)((long)&obj->twiddle2[0].re + lVar13);
    *(double *)((long)oup + lVar13 + -8) =
         (dVar17 * dVar7 + *(double *)((long)obj->twiddle2 + lVar13 + -8) * dVar16 + dVar5 + dVar3)
         * 0.5;
    *(double *)((long)&oup->re + lVar13) =
         ((dVar17 * *(double *)((long)obj->twiddle2 + lVar13 + -8) + (dVar4 - dVar6)) -
         dVar16 * dVar7) * 0.5;
    lVar13 = lVar13 + 0x10;
    lVar9 = lVar9 + -0x10;
  }
  oup[lVar15].re = dVar1 - dVar2;
  oup[lVar15].im = 0.0;
  pdVar10 = &oup[(long)(int)(uVar8 * 2) + -1].im;
  pdVar14 = &oup[1].im;
  for (lVar9 = 1; lVar9 < lVar15; lVar9 = lVar9 + 1) {
    ((fft_data *)(pdVar10 + -1))->re = ((fft_data *)(pdVar14 + -1))->re;
    *pdVar10 = -*pdVar14;
    pdVar14 = pdVar14 + 2;
    pdVar10 = pdVar10 + -2;
  }
  free(inp_00);
  free(oup_00);
  return;
}

Assistant:

void fft_r2c_exec(fft_real_object obj,fft_type *inp,fft_data *oup) {
	fft_data* cinp;
	fft_data* coup;
	int i,N2,N;
	fft_type temp1,temp2;
	N2 = obj->cobj->N;
	N = N2*2;
	
	cinp = (fft_data*) malloc (sizeof(fft_data) * N2);
	coup = (fft_data*) malloc (sizeof(fft_data) * N2);
	
	for (i = 0; i < N2; ++i) {
		cinp[i].re = inp[2*i];
		cinp[i].im = inp[2*i+1];
	}
	
	fft_exec(obj->cobj,cinp,coup);
	
	oup[0].re = coup[0].re + coup[0].im;
	oup[0].im = 0.0;
	
	for (i = 1; i < N2; ++i) {
		temp1 = coup[i].im + coup[N2-i].im ;
		temp2 = coup[N2-i].re - coup[i].re ;
		oup[i].re = (coup[i].re + coup[N2-i].re + (temp1 * obj->twiddle2[i].re) + (temp2 * obj->twiddle2[i].im)) / 2.0;
		oup[i].im = (coup[i].im - coup[N2-i].im + (temp2 * obj->twiddle2[i].re) - (temp1 * obj->twiddle2[i].im)) / 2.0;
	}
	
	
	
	oup[N2].re = coup[0].re - coup[0].im;
	oup[N2].im = 0.0;
	
	for (i = 1; i < N2;++i) {
		oup[N-i].re = oup[i].re; 
		oup[N-i].im = -oup[i].im; 
	}
	
		
	free(cinp);
	free(coup);

}